

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void __thiscall
ByteCodeGenerator::EmitScopeList
          (ByteCodeGenerator *this,ParseNode *pnode,ParseNode *breakOnBodyScopeNode)

{
  OpCode OVar1;
  short sVar2;
  FuncInfo *pFVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  ParseNodeWith *pPVar7;
  ParseNodeFnc *pPVar8;
  ParseNodeCatch *pnodeCatch;
  ParseNodeBlock *pnodeBlock;
  ParseNodeFnc *pPVar9;
  undefined8 uVar10;
  undefined1 local_50 [8];
  ExclusiveContext context;
  
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
LAB_00760527:
  do {
    while( true ) {
      if (pnode == breakOnBodyScopeNode || (ScriptContext *)pnode == (ScriptContext *)0x0) {
        return;
      }
      OVar1 = *(OpCode *)
               &(((ScriptContext *)pnode)->super_ScriptContextInfo)._vptr_ScriptContextInfo;
      if (OVar1 == knopCatch) {
        pnodeCatch = ParseNode::AsParseNodeCatch(pnode);
        StartEmitCatch(this,pnodeCatch);
        EmitScopeList(this,pnodeCatch->pnodeScopes,(ParseNode *)0x0);
        EndEmitCatch(this,pnodeCatch);
        pnode = pnodeCatch->pnodeNext;
        goto LAB_00760527;
      }
      if (OVar1 == knopProg) goto LAB_007605fd;
      if (OVar1 == knopBlock) {
        pnodeBlock = ParseNode::AsParseNodeBlock(pnode);
        StartEmitBlock(this,pnodeBlock);
        EmitScopeList(this,pnodeBlock->pnodeScopes,(ParseNode *)0x0);
        EndEmitBlock(this,pnodeBlock);
        pnode = pnodeBlock->pnodeNext;
        goto LAB_00760527;
      }
      if (OVar1 == knopWith) {
        StartEmitWith(this,pnode);
        pPVar7 = ParseNode::AsParseNodeWith(pnode);
        EmitScopeList(this,pPVar7->pnodeScopes,(ParseNode *)0x0);
        EndEmitWith(this,pnode);
        pPVar7 = ParseNode::AsParseNodeWith(pnode);
        pnode = pPVar7->pnodeNext;
        goto LAB_00760527;
      }
      if (OVar1 == knopFncDecl) break;
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0xd90,"(false)","Unexpected opcode in tree of scopes");
      if (!bVar5) goto LAB_007607e6;
      *puVar6 = 0;
    }
    pPVar8 = ParseNode::AsParseNodeFnc(pnode);
    if ((pPVar8->fncFlags & kFunctionAsmjsMode) == kFunctionNone) {
LAB_007605fd:
      pPVar8 = ParseNode::AsParseNodeFnc(pnode);
      if (pPVar8->funcInfo != (FuncInfo *)0x0) {
        context.scriptContext = (ScriptContext *)breakOnBodyScopeNode;
        pPVar8 = ParseNode::AsParseNodeFnc(pnode);
        pFVar3 = pPVar8->funcInfo;
        pFVar3->currentChildScope = (&pFVar3->paramScope)[*(ushort *)&pFVar3->field_0xb4 >> 0xf];
        pPVar8 = ParseNode::AsParseNodeFnc(pnode);
        StartEmitFunction(this,pPVar8);
        sVar2 = *(short *)&pFVar3->field_0xb4;
        pPVar8 = ParseNode::AsParseNodeFnc(pnode);
        if (-1 < sVar2) {
          pPVar8 = (ParseNodeFnc *)pPVar8->pnodeBodyScope;
        }
        EmitScopeList(this,(ParseNode *)pPVar8->pnodeScopes,(ParseNode *)0x0);
        pPVar8 = ParseNode::AsParseNodeFnc(pnode);
        EmitOneFunction(this,pPVar8);
        pPVar8 = ParseNode::AsParseNodeFnc(pnode);
        EndEmitFunction(this,pPVar8);
        pPVar8 = ParseNode::AsParseNodeFnc(pnode);
        breakOnBodyScopeNode = (ParseNode *)context.scriptContext;
        if (((pPVar8->pnodeBody != (ParseNodePtr)0x0) && ((pFVar3->field_0xb6 & 1) == 0)) &&
           (pFVar3->currentChildScope != pFVar3->bodyScope)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0xd6f,
                             "(pnode->AsParseNodeFnc()->pnodeBody == nullptr || funcInfo->isReused || funcInfo->GetCurrentChildScope() == funcInfo->GetBodyScope())"
                             ,
                             "pnode->AsParseNodeFnc()->pnodeBody == nullptr || funcInfo->isReused || funcInfo->GetCurrentChildScope() == funcInfo->GetBodyScope()"
                            );
          if (!bVar5) {
LAB_007607e6:
            pcVar4 = (code *)invalidInstructionException();
            (*pcVar4)();
          }
          *puVar6 = 0;
        }
        pFVar3->currentChildScope = (Scope *)0x0;
      }
    }
    else {
      context.byteCodeGenerator = (ByteCodeGenerator *)this->scriptContext;
      local_50 = (undefined1  [8])this;
      pPVar8 = ParseNode::AsParseNodeFnc(pnode);
      pPVar9 = ParseNode::AsParseNodeFnc(pnode);
      bVar5 = Js::AsmJSCompiler::Compile
                        ((ExclusiveContext *)local_50,&pPVar8->super_ParseNode,pPVar9->pnodeParams);
      if (!bVar5) {
        if (DAT_014302f9 == '\x01') {
          PAL_exit(-0x7ff5ebe4);
        }
        uVar10 = __cxa_allocate_exception(1);
        __cxa_throw(uVar10,&Js::AsmJsParseException::typeinfo,0);
      }
    }
    pPVar8 = ParseNode::AsParseNodeFnc(pnode);
    pnode = pPVar8->pnodeNext;
  } while( true );
}

Assistant:

void ByteCodeGenerator::EmitScopeList(ParseNode *pnode, ParseNode *breakOnBodyScopeNode)
{
    while (pnode)
    {
        if (breakOnBodyScopeNode != nullptr && breakOnBodyScopeNode == pnode)
        {
            break;
        }

        switch (pnode->nop)
        {
        case knopFncDecl:
#ifdef ASMJS_PLAT
            if (pnode->AsParseNodeFnc()->GetAsmjsMode())
            {
                Js::ExclusiveContext context(this, GetScriptContext());
                if (Js::AsmJSCompiler::Compile(&context, pnode->AsParseNodeFnc(), pnode->AsParseNodeFnc()->pnodeParams))
                {
                    pnode = pnode->AsParseNodeFnc()->pnodeNext;
                    break;
                }
                else if (CONFIG_FLAG(AsmJsStopOnError))
                {
                    exit(JSERR_AsmJsCompileError);
                }
                else
                {
                    // If deferral is not allowed, throw and reparse everything with asm.js disabled.
                    throw Js::AsmJsParseException();
                }
            }
#endif
            // FALLTHROUGH
        case knopProg:
            if (pnode->AsParseNodeFnc()->funcInfo)
            {
                FuncInfo* funcInfo = pnode->AsParseNodeFnc()->funcInfo;
                Scope* paramScope = funcInfo->GetParamScope();

                if (!funcInfo->IsBodyAndParamScopeMerged())
                {
                    funcInfo->SetCurrentChildScope(paramScope);
                }
                else
                {
                    funcInfo->SetCurrentChildScope(funcInfo->GetBodyScope());
                }
                this->StartEmitFunction(pnode->AsParseNodeFnc());

                if (!funcInfo->IsBodyAndParamScopeMerged())
                {
                    this->EmitScopeList(pnode->AsParseNodeFnc()->pnodeBodyScope->pnodeScopes);
                }
                else
                {
                    this->EmitScopeList(pnode->AsParseNodeFnc()->pnodeScopes);
                }

                this->EmitOneFunction(pnode->AsParseNodeFnc());
                this->EndEmitFunction(pnode->AsParseNodeFnc());

                Assert(pnode->AsParseNodeFnc()->pnodeBody == nullptr || funcInfo->isReused || funcInfo->GetCurrentChildScope() == funcInfo->GetBodyScope());
                funcInfo->SetCurrentChildScope(nullptr);
            }
            pnode = pnode->AsParseNodeFnc()->pnodeNext;
            break;

        case knopBlock:
        {
            ParseNodeBlock * pnodeBlock = pnode->AsParseNodeBlock();
            this->StartEmitBlock(pnodeBlock);
            this->EmitScopeList(pnodeBlock->pnodeScopes);
            this->EndEmitBlock(pnodeBlock);
            pnode = pnodeBlock->pnodeNext;
            break;
        }
        case knopCatch:
        {
            ParseNodeCatch * pnodeCatch = pnode->AsParseNodeCatch();
            this->StartEmitCatch(pnodeCatch);
            this->EmitScopeList(pnodeCatch->pnodeScopes);
            this->EndEmitCatch(pnodeCatch);
            pnode = pnodeCatch->pnodeNext;
            break;
        }

        case knopWith:
            this->StartEmitWith(pnode);
            this->EmitScopeList(pnode->AsParseNodeWith()->pnodeScopes);
            this->EndEmitWith(pnode);
            pnode = pnode->AsParseNodeWith()->pnodeNext;
            break;

        default:
            AssertMsg(false, "Unexpected opcode in tree of scopes");
            break;
        }
    }
}